

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_access.cpp
# Opt level: O2

int embree::main(int argc,char **argv)

{
  RTCError code;
  RTCDevice device_i;
  RTCScene scene_i;
  RTCDevice userPtr;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_28;
  
  MXCSR = MXCSR | 0x8040;
  device_i = (RTCDevice)rtcNewDevice("tri_accel=bvh4.triangle4v");
  userPtr = device_i;
  code = rtcGetDeviceError();
  error_handler(userPtr,code,(char *)0x0);
  rtcSetDeviceErrorFunction(device_i,error_handler,0);
  scene_i = (RTCScene)rtcNewScene(device_i);
  local_28._0_8_ = 0xbf800000;
  local_28._8_8_ = 0;
  addCube(device_i,scene_i,(Vec3fa *)&local_28.field_1);
  local_28._0_8_ = 0x3f800000;
  local_28._8_8_ = 0;
  addCube(device_i,scene_i,(Vec3fa *)&local_28.field_1);
  local_28._0_8_ = 0;
  local_28._8_8_ = 0xbf800000;
  addCube(device_i,scene_i,(Vec3fa *)&local_28.field_1);
  local_28._0_8_ = 0;
  local_28._8_8_ = 0x3f800000;
  addCube(device_i,scene_i,(Vec3fa *)&local_28.field_1);
  addHair(device_i,scene_i);
  addGroundPlane(device_i,scene_i);
  rtcCommitScene(scene_i);
  print_bvh(scene_i);
  rtcReleaseScene(scene_i);
  rtcReleaseDevice(device_i);
  waitForKeyPressedUnderWindows();
  return 0;
}

Assistant:

int main(int argc, char** argv) 
  {
    /* for best performance set FTZ and DAZ flags in MXCSR control and status register */
    _MM_SET_FLUSH_ZERO_MODE(_MM_FLUSH_ZERO_ON);
    _MM_SET_DENORMALS_ZERO_MODE(_MM_DENORMALS_ZERO_ON);

    /* create new Embree device and force bvh4.triangle4v hierarchy for triangles */
    RTCDevice device = rtcNewDevice("tri_accel=bvh4.triangle4v");
    error_handler(nullptr,rtcGetDeviceError(device));
    
    /* set error handler */
    rtcSetDeviceErrorFunction(device,error_handler,nullptr);
    
    /* create scene */
    RTCScene scene = rtcNewScene(device);
    addCube(device,scene,Vec3fa(-1,0,0));
    addCube(device,scene,Vec3fa(1,0,0));
    addCube(device,scene,Vec3fa(0,0,-1));
    addCube(device,scene,Vec3fa(0,0,1));
    addHair(device,scene);
    addGroundPlane(device,scene);
    rtcCommitScene (scene);
    /* print triangle BVH */
    print_bvh(scene);

    /* cleanup */
    rtcReleaseScene (scene);
    rtcReleaseDevice(device);

    /* wait for user input under Windows when opened in separate window */
    waitForKeyPressedUnderWindows();
    
    return 0;
  }